

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__backend_timeout(uv_loop_t *loop)

{
  uv_loop_t *loop_local;
  
  if (((loop->stop_flag == 0) &&
      (((loop->active_handles != 0 || ((loop->active_reqs).count != 0)) &&
       (loop->pending_queue == (void **)loop->pending_queue[0])))) &&
     ((loop->idle_handles == (void **)loop->idle_handles[0] &&
      (loop->closing_handles == (uv_handle_t *)0x0)))) {
    loop_local._4_4_ = uv__next_timeout(loop);
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

static int uv__backend_timeout(const uv_loop_t* loop) {
  if (loop->stop_flag == 0 &&
      /* uv__loop_alive(loop) && */
      (uv__has_active_handles(loop) || uv__has_active_reqs(loop)) &&
      QUEUE_EMPTY(&loop->pending_queue) &&
      QUEUE_EMPTY(&loop->idle_handles) &&
      loop->closing_handles == NULL)
    return uv__next_timeout(loop);
  return 0;
}